

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalSerialize
          (CustomModel_CustomModelParamValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  string *s;
  int32_t value;
  int64_t value_00;
  double value_01;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 10) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[0] == 10) {
      value_01 = (this->value_).doublevalue_;
    }
    else {
      value_01 = 0.0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(10,value_01,puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x14) {
    puVar3 = (undefined8 *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar3,*(int *)(puVar3 + 1),SERIALIZE,
               "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    if (this->_oneof_case_[0] == 0x14) {
      s = (string *)((this->value_).longvalue_ & 0xfffffffffffffffe);
    }
    else {
      s = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x14,s,target);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x1e) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value = 0;
    if (this->_oneof_case_[0] == 0x1e) {
      value = (this->value_).intvalue_;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x1e,value,puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x28) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (this->_oneof_case_[0] == 0x28) {
      value_00 = (this->value_).longvalue_;
    }
    else {
      value_00 = 0;
    }
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(0x28,value_00,puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x32) {
    puVar2 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x32,(bool)(this->_oneof_case_[0] == 0x32 & (this->value_).boolvalue_),
                        puVar2);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 0x3c) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0x3c,(string *)((this->value_).longvalue_ & 0xfffffffffffffffe),
                        target);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  uVar4 = uVar4 & 0xfffffffffffffffc;
  puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar4 + 8),*(int *)(uVar4 + 0x10),target);
  return puVar2;
}

Assistant:

uint8_t* CustomModel_CustomModelParamValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // double doubleValue = 10;
  if (_internal_has_doublevalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(10, this->_internal_doublevalue(), target);
  }

  // string stringValue = 20;
  if (_internal_has_stringvalue()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_stringvalue().data(), static_cast<int>(this->_internal_stringvalue().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CustomModel.CustomModelParamValue.stringValue");
    target = stream->WriteStringMaybeAliased(
        20, this->_internal_stringvalue(), target);
  }

  // int32 intValue = 30;
  if (_internal_has_intvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(30, this->_internal_intvalue(), target);
  }

  // int64 longValue = 40;
  if (_internal_has_longvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(40, this->_internal_longvalue(), target);
  }

  // bool boolValue = 50;
  if (_internal_has_boolvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(50, this->_internal_boolvalue(), target);
  }

  // bytes bytesValue = 60;
  if (_internal_has_bytesvalue()) {
    target = stream->WriteBytesMaybeAliased(
        60, this->_internal_bytesvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CustomModel.CustomModelParamValue)
  return target;
}